

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendar.cpp
# Opt level: O2

qint64 __thiscall
QCalendarBackend::matchCenturyToWeekday(QCalendarBackend *this,YearMonthDay *parts,int dow)

{
  longlong *plVar1;
  longlong lVar2;
  int offset;
  int centuries;
  int centuries_00;
  long in_FS_OFFSET;
  optional<long_long> oVar3;
  anon_class_24_3_f321b97e local_60;
  _Storage<long_long,_true> local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.parts.day = parts->day;
  local_60.parts.year = parts->year;
  local_60.parts.month = parts->month;
  lVar2 = -0x8000000000000000;
  centuries = 0;
  centuries_00 = 0;
  local_60.dow = dow;
  local_60.this = this;
  do {
    if (centuries_00 == -0xf) {
LAB_003088e5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return lVar2;
      }
      __stack_chk_fail();
    }
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    oVar3 = matchCenturyToWeekday::anon_class_24_3_f321b97e::operator()(&local_60,centuries);
    local_48._M_value =
         oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>._M_payload;
    local_40 = (undefined1 *)
               CONCAT71(local_40._1_7_,
                        oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
                        super__Optional_payload_base<long_long>._M_engaged);
    if (((undefined1  [16])
         oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
LAB_003088d8:
      plVar1 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
               _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *
                      )&local_48);
      lVar2 = *plVar1;
      goto LAB_003088e5;
    }
    if (centuries_00 != 0) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      oVar3 = matchCenturyToWeekday::anon_class_24_3_f321b97e::operator()(&local_60,centuries_00);
      local_48._M_value =
           oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>._M_payload;
      local_40 = (undefined1 *)
                 CONCAT71(local_40._1_7_,
                          oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
                          super__Optional_payload_base<long_long>._M_engaged);
      if (((undefined1  [16])
           oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
         ) goto LAB_003088d8;
    }
    centuries = centuries + 1;
    centuries_00 = centuries_00 + -1;
  } while( true );
}

Assistant:

qint64 QCalendarBackend::matchCenturyToWeekday(const QCalendar::YearMonthDay &parts, int dow) const
{
    Q_ASSERT(parts.isValid());
    // Brute-force solution as fall-back.
    const auto checkOffset = [parts, dow, this](int centuries) -> std::optional<qint64> {
        // Offset parts.year by the given number of centuries:
        int year = parts.year + centuries * 100;
        // but take into account the effect of crossing zero, if we did:
        if (!hasYearZero() && (parts.year > 0) != (year > 0))
            year += parts.year > 0 ? -1 : +1;
        qint64 jd;
        if (isDateValid(year, parts.month, parts.day)
            && dateToJulianDay(year, parts.month, parts.day, &jd)
            && dayOfWeek(jd) == dow) {
            return jd;
        }
        return std::nullopt;
    };
    // Empirically, aside from Gregorian, each calendar finds every dow within
    // any 29-century run, so 14 centuries is the biggest offset we ever need.
    for (int offset = 0; offset < 15; ++offset) {
        if (auto jd = checkOffset(offset))
            return *jd;
        if (offset) {
            if (auto jd = checkOffset(-offset))
                return *jd;
        }
    }
    return (std::numeric_limits<qint64>::min)();
}